

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

iterator * __thiscall Catch::clara::TextFlow::Columns::iterator::operator++(iterator *this)

{
  iterator *this_00;
  pointer piVar1;
  pointer pCVar2;
  ulong uVar3;
  long lVar4;
  
  pCVar2 = (this->m_columns->
           super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_columns->
      super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
      )._M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      piVar1 = (this->m_iterators).
               super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = (iterator *)((long)&piVar1->m_column + lVar4);
      if (((*(long *)((long)&piVar1->m_pos + lVar4) != 0) ||
          (*(long *)((long)&piVar1->m_stringIndex + lVar4) !=
           *(long *)((long)&(pCVar2->m_strings).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + lVar4) -
           *(long *)((long)&(pCVar2->m_strings).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar4) >> 5)) ||
         ((Column *)
          ((long)&(pCVar2->m_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar4) != this_00->m_column)) {
        Column::iterator::operator++(this_00);
      }
      uVar3 = uVar3 + 1;
      pCVar2 = (this->m_columns->
               super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x30;
    } while (uVar3 < (ulong)(((long)(this->m_columns->
                                    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 4)
                            * -0x5555555555555555));
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			for (size_t i = 0; i < m_columns.size(); ++i) {
				if (m_iterators[i] != m_columns[i].end())
					++m_iterators[i];
			}
			return *this;
		}